

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O2

bool __thiscall
cmLoadedCommand::InitialPass
          (cmLoadedCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  int iVar2;
  char **argv;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  int argc;
  ulong uVar6;
  bool bVar7;
  allocator<char> local_59;
  cmLoadedCommandInfo *local_58;
  string local_50;
  
  if ((this->info).InitialPass == (CM_INITIAL_PASS_FUNCTION)0x0) {
    bVar7 = true;
  }
  else {
    free((this->info).Error);
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
    uVar6 = uVar5 >> 5;
    lVar4 = 0;
    argc = (int)uVar6;
    if (argc == 0) {
      argv = (char **)0x0;
    }
    else {
      argv = (char **)malloc((long)(uVar5 * 0x8000000) >> 0x1d);
    }
    local_58 = &this->info;
    uVar5 = 0;
    if (0 < argc) {
      uVar5 = uVar6 & 0xffffffff;
    }
    for (; uVar5 * 8 != lVar4; lVar4 = lVar4 + 8) {
      pcVar3 = strdup(*(char **)((long)&(pbVar1->_M_dataplus)._M_p + lVar4 * 4));
      *(char **)((long)argv + lVar4) = pcVar3;
    }
    InstallSignalHandlers((this->info).Name,0);
    iVar2 = (*(this->info).InitialPass)(local_58,(this->super_cmCommand).Makefile,argc,argv);
    InstallSignalHandlers((this->info).Name,1);
    cmFreeArguments(argc,argv);
    bVar7 = iVar2 != 0;
    pcVar3 = (this->info).Error;
    if (pcVar3 != (char *)0x0 && !bVar7) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar3,&local_59);
      cmCommand::SetError(&this->super_cmCommand,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar7 = false;
    }
  }
  return bVar7;
}

Assistant:

bool cmLoadedCommand::InitialPass(std::vector<std::string> const& args,
                                  cmExecutionStatus&)
{
  if (!info.InitialPass) {
    return true;
  }

  // clear the error string
  if (this->info.Error) {
    free(this->info.Error);
  }

  // create argc and argv and then invoke the command
  int argc = static_cast<int>(args.size());
  char** argv = nullptr;
  if (argc) {
    argv = static_cast<char**>(malloc(argc * sizeof(char*)));
  }
  int i;
  for (i = 0; i < argc; ++i) {
    argv[i] = strdup(args[i].c_str());
  }
  cmLoadedCommand::InstallSignalHandlers(info.Name);
  int result = info.InitialPass(&info, this->Makefile, argc, argv);
  cmLoadedCommand::InstallSignalHandlers(info.Name, 1);
  cmFreeArguments(argc, argv);

  if (result) {
    return true;
  }

  /* Initial Pass must have failed so set the error string */
  if (this->info.Error) {
    this->SetError(this->info.Error);
  }
  return false;
}